

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_2,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  long lVar1;
  Type in1;
  Type in0;
  Vector<float,_2> local_58;
  Vector<float,_2> local_50;
  float local_44 [3];
  int local_38 [6];
  undefined4 local_20;
  float local_1c;
  undefined4 local_18;
  float local_14;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_50.m_data = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    local_50.m_data[0] = 1.2;
    local_50.m_data[1] = 0.5;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_58.m_data = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    local_58.m_data[0] = 0.5;
    local_58.m_data[1] = 1.0;
  }
  outerProduct<float,2,2>((MatrixCaseUtils *)&local_20,&local_50,&local_58);
  local_44[0] = (float)local_20;
  local_44[1] = (float)local_18;
  local_44[2] = local_1c + local_14;
  local_38[2] = 0;
  local_38[3] = 1;
  local_38[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[local_38[lVar1]] = local_50.m_data[lVar1 + 1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}